

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bundle_adjustment.cc
# Opt level: O2

void __thiscall sfm::ba::BundleAdjustment::print_status(BundleAdjustment *this,bool detailed)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,detailed) == 0) {
    std::operator<<((ostream *)&std::cout,"BA: MSE ");
    poVar1 = std::ostream::_M_insert<double>((this->status).initial_mse);
    std::operator<<(poVar1," -> ");
    poVar1 = std::ostream::_M_insert<double>((this->status).final_mse);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->status).num_lm_iterations);
    poVar1 = std::operator<<(poVar1," LM iters, ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->status).num_cg_iterations);
    poVar1 = std::operator<<(poVar1," CG iters, ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"ms.");
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Bundle Adjustment Status:");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::operator<<((ostream *)&std::cout,"  Initial MSE: ");
    poVar1 = std::ostream::_M_insert<double>((this->status).initial_mse);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::operator<<((ostream *)&std::cout,"  Final MSE: ");
    poVar1 = std::ostream::_M_insert<double>((this->status).final_mse);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"  LM iterations: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->status).num_lm_iterations);
    poVar1 = std::operator<<(poVar1," (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->status).num_lm_successful_iterations)
    ;
    poVar1 = std::operator<<(poVar1," successful, ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,(this->status).num_lm_unsuccessful_iterations);
    poVar1 = std::operator<<(poVar1," unsuccessful)");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"  CG iterations: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->status).num_cg_iterations);
  }
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void
BundleAdjustment::print_status (bool detailed) const
{
    if (!detailed)
    {
        std::cout << "BA: MSE " << this->status.initial_mse
            << " -> " << this->status.final_mse << ", "
            << this->status.num_lm_iterations << " LM iters, "
            << this->status.num_cg_iterations << " CG iters, "
            << this->status.runtime_ms << "ms."
            << std::endl;
        return;
    }

    std::cout << "Bundle Adjustment Status:" << std::endl;
    std::cout << "  Initial MSE: "
        << this->status.initial_mse << std::endl;
    std::cout << "  Final MSE: "
        << this->status.final_mse << std::endl;
    std::cout << "  LM iterations: "
        << this->status.num_lm_iterations << " ("
        << this->status.num_lm_successful_iterations << " successful, "
        << this->status.num_lm_unsuccessful_iterations << " unsuccessful)"
        << std::endl;
    std::cout << "  CG iterations: "
        << this->status.num_cg_iterations << std::endl;
}